

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

Bounds3f * __thiscall
pbrt::BilinearPatch::Bounds(Bounds3f *__return_storage_ptr__,BilinearPatch *this)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  lVar3 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar6 = (long)this->blpIndex * 0x10;
  lVar7 = *(long *)(lVar3 + 0x10);
  lVar3 = *(long *)(lVar3 + 0x18);
  iVar2 = *(int *)(lVar7 + lVar6);
  lVar8 = (long)*(int *)(lVar7 + 4 + lVar6);
  lVar9 = (long)*(int *)(lVar7 + 8 + lVar6);
  lVar7 = (long)*(int *)(lVar7 + 0xc + lVar6);
  auVar10 = ZEXT416(*(uint *)(lVar3 + 8 + lVar9 * 0xc));
  auVar11 = ZEXT416(*(uint *)(lVar3 + 8 + (long)iVar2 * 0xc));
  auVar4 = vminss_avx(auVar10,auVar11);
  auVar10 = vmaxss_avx(auVar10,auVar11);
  auVar12 = ZEXT416(*(uint *)(lVar3 + 8 + lVar7 * 0xc));
  auVar13 = ZEXT416(*(uint *)(lVar3 + 8 + lVar8 * 0xc));
  auVar11 = vminss_avx(auVar12,auVar13);
  auVar5 = vminss_avx(auVar11,auVar4);
  auVar4 = vmaxss_avx(auVar12,auVar13);
  auVar11 = vmaxss_avx(auVar4,auVar10);
  auVar10._8_4_ = 0xff7fffff;
  auVar10._0_8_ = 0xff7fffffff7fffff;
  auVar10._12_4_ = 0xff7fffff;
  (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
  (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
  *(undefined8 *)&(__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.z =
       0xff7fffff7f7fffff;
  uVar1 = vmovlps_avx(auVar10);
  (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar1;
  (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.z =
       (float)(int)((ulong)uVar1 >> 0x20);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(lVar3 + lVar9 * 0xc);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(lVar3 + (long)iVar2 * 0xc);
  auVar10 = vminps_avx(auVar12,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(lVar3 + lVar7 * 0xc);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(lVar3 + lVar8 * 0xc);
  auVar4 = vminps_avx(auVar14,auVar15);
  auVar10 = vminps_avx(auVar4,auVar10);
  uVar1 = vmovlps_avx(auVar10);
  (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->pMin).super_Tuple3<pbrt::Point3,_float>.z = auVar5._0_4_;
  auVar10 = vmaxps_avx(auVar12,auVar13);
  auVar4 = vmaxps_avx(auVar14,auVar15);
  auVar10 = vmaxps_avx(auVar4,auVar10);
  uVar1 = vmovlps_avx(auVar10);
  (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->pMax).super_Tuple3<pbrt::Point3,_float>.z = auVar11._0_4_;
  return __return_storage_ptr__;
}

Assistant:

Bounds3f BilinearPatch::Bounds() const {
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    return Union(Bounds3f(p00, p01), Bounds3f(p10, p11));
}